

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_future.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  tst_future tc;
  QCoreApplication app;
  int local_2c;
  undefined **local_28 [2];
  QCoreApplication local_18 [16];
  
  local_2c = argc;
  QCoreApplication::QCoreApplication(local_18,&local_2c,argv,0x60204);
  QCoreApplication::setAttribute(AA_Use96Dpi,true);
  QObject::QObject((QObject *)local_28,(QObject *)0x0);
  local_28[0] = &PTR_metaObject_0012fcd8;
  QTest::setMainSourcePath
            ("/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/build_O3/tests/auto/qtpromise/future"
            );
  iVar1 = QTest::qExec((QObject *)local_28,local_2c,argv);
  QObject::~QObject((QObject *)local_28);
  QCoreApplication::~QCoreApplication(local_18);
  return iVar1;
}

Assistant:

void tst_future::fulfilled()
{
    int result = -1;
    auto p = QtPromise::resolve(QtConcurrent::run([]() {
        return 42;
    }));

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));
    QCOMPARE(p.isPending(), true);

    p.then([&](int res) {
         result = res;
     }).wait();

    QCOMPARE(p.isFulfilled(), true);
    QCOMPARE(result, 42);
}